

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=
          (Option<Catch::GroupInfo> *this,Option<Catch::GroupInfo> *_other)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  size_t sVar3;
  
  pGVar1 = this->nullableValue;
  if ((pGVar1 != (GroupInfo *)0x0) &&
     (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pGVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  this->nullableValue = (GroupInfo *)0x0;
  pGVar1 = _other->nullableValue;
  if (pGVar1 != (GroupInfo *)0x0) {
    *(char **)this->storage = this->storage + 0x10;
    pcVar2 = (pGVar1->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this->storage,pcVar2,pcVar2 + (pGVar1->name)._M_string_length);
    sVar3 = pGVar1->groupsCounts;
    *(size_t *)(this->storage + 0x20) = pGVar1->groupIndex;
    *(size_t *)(this->storage + 0x28) = sVar3;
    this->nullableValue = (GroupInfo *)this->storage;
  }
  return this;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }